

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

void __thiscall MeshLib::Solid::destroyVertex(Solid *this,Vertex *vertex)

{
  int *piVar1;
  pointer pcVar2;
  Node<MeshLib::Vertex> *pNVar3;
  
  if (vertex->m_halfedge != (HalfEdge *)0x0) {
    __assert_fail("vertex->halfedge () == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                  ,0x56,"void MeshLib::Solid::destroyVertex(Vertex *)");
  }
  if (vertex->m_trait == (Trait *)0x0) {
    pNVar3 = AVL::Node<MeshLib::Vertex>::remove_node((this->m_verts).root,vertex);
    (this->m_verts).root = pNVar3;
    if (pNVar3 != (Node<MeshLib::Vertex> *)0x0) {
      piVar1 = &(this->m_verts).size;
      *piVar1 = *piVar1 + -1;
    }
    pcVar2 = (vertex->m_string)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(vertex->m_string).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(vertex);
    return;
  }
  __assert_fail("vertex->trait () == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/icemiliang[P]spherical_harmonic_maps/src/Solid.cpp"
                ,0x57,"void MeshLib::Solid::destroyVertex(Vertex *)");
}

Assistant:

void Solid::destroyVertex(Vertex * vertex)
{
    assert(vertex->halfedge () == NULL);
	assert(vertex->trait () == NULL);

	m_verts.remove (vertex);
    delete vertex;
}